

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O3

void g_tree_foreach(GTree *tree,GTraverseFunc func,gpointer user_data)

{
  gboolean gVar1;
  GTreeNode *tmp_1;
  GTreeNode *pGVar2;
  GTreeNode *tmp;
  GTreeNode *pGVar3;
  
  pGVar3 = tree->root;
  if (pGVar3 != (GTreeNode *)0x0) {
    for (; pGVar3->left_child != '\0'; pGVar3 = pGVar3->left) {
    }
    do {
      gVar1 = (*func)(pGVar3->key,pGVar3->value,user_data);
      if (gVar1 != 0) {
        return;
      }
      pGVar2 = pGVar3->right;
      if (pGVar3->right_child != '\0') {
        for (; pGVar2->left_child != '\0'; pGVar2 = pGVar2->left) {
        }
      }
      pGVar3 = pGVar2;
    } while (pGVar2 != (GTreeNode *)0x0);
  }
  return;
}

Assistant:

void g_tree_foreach (GTree *tree, GTraverseFunc func, gpointer user_data)
{
    GTreeNode *node;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
        return;

    node = g_tree_first_node (tree);

    while (node)
    {
        if ((*func) (node->key, node->value, user_data))
            break;

        node = g_tree_node_next (node);
    }
}